

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::ipc::ClientImpl::TryConnect(ClientImpl *this)

{
  undefined1 __p [8];
  allocator<char> local_39;
  undefined1 local_38 [8];
  string local_30;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_38 + 8),this->socket_name_,&local_39);
  base::UnixSocket::Connect
            ((UnixSocket *)local_38,(string *)(local_38 + 8),&this->super_EventListener,
             this->task_runner_,kUnix,kStream,kIgnore);
  __p = local_38;
  local_38 = (undefined1  [8])0x0;
  std::__uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
  ::reset((__uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
           *)&this->sock_,(pointer)__p);
  std::unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
  ~unique_ptr((unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
               *)local_38);
  ::std::__cxx11::string::~string((string *)(local_38 + 8));
  return;
}

Assistant:

void ClientImpl::TryConnect() {
  PERFETTO_DCHECK(socket_name_);
  sock_ = base::UnixSocket::Connect(socket_name_, this, task_runner_,
                                    kClientSockFamily, base::SockType::kStream,
                                    base::SockPeerCredMode::kIgnore);
}